

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void kratos::string::trim(string *s)

{
  string *s_local;
  
  ltrim(s);
  rtrim(s);
  return;
}

Assistant:

void trim(std::string &s) {
    ltrim(s);
    rtrim(s);
}